

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O0

int SendStereoAudio(int samples_requested,ssize_t in_size,int32_t *_in,ssize_t out_pos,
                   OPN2_UInt8 *left,OPN2_UInt8 *right,OPNMIDI_AudioFormat *format)

{
  OPNMIDI_SampleType OVar1;
  uint uVar2;
  uint sampleOffset_00;
  ulong uVar3;
  unsigned_long *puVar4;
  _func_int_int32_t *local_c0;
  _func_int_int32_t *local_b8;
  _func_int_int32_t *local_a8;
  _func_int_int32_t *local_98;
  pfnConvert cvt_3;
  pfnConvert cvt_2;
  pfnConvert cvt_1;
  pfnConvert cvt;
  uint sampleOffset;
  uint containerSize;
  OPNMIDI_SampleType sampleType;
  size_t toCopy;
  size_t maxSamples;
  size_t inSamples;
  size_t outputOffset;
  OPN2_UInt8 *right_local;
  OPN2_UInt8 *left_local;
  ssize_t out_pos_local;
  int32_t *_in_local;
  ssize_t in_size_local;
  int samples_requested_local;
  
  if (in_size != 0) {
    maxSamples = in_size * 2;
    toCopy = samples_requested - out_pos;
    inSamples = out_pos;
    outputOffset = (size_t)right;
    right_local = left;
    left_local = (OPN2_UInt8 *)out_pos;
    out_pos_local = (ssize_t)_in;
    _in_local = (int32_t *)in_size;
    in_size_local._0_4_ = samples_requested;
    puVar4 = std::min<unsigned_long>(&toCopy,&maxSamples);
    uVar3 = *puVar4;
    OVar1 = format->type;
    uVar2 = format->containerSize;
    sampleOffset_00 = format->sampleOffset;
    right_local = right_local + (inSamples >> 1) * (ulong)sampleOffset_00;
    outputOffset = outputOffset + (inSamples >> 1) * (ulong)sampleOffset_00;
    switch(OVar1) {
    case OPNMIDI_SampleType_S16:
    case OPNMIDI_SampleType_U16:
      if (OVar1 == OPNMIDI_SampleType_S16) {
        local_a8 = opn2_cvtS16;
      }
      else {
        local_a8 = opn2_cvtU16;
      }
      if (uVar2 == 2) {
        CopySamplesTransformed<short,int>
                  (right_local,(OPN2_UInt8 *)outputOffset,(int32_t *)out_pos_local,uVar3 >> 1,
                   sampleOffset_00,local_a8);
      }
      else {
        if (uVar2 != 4) {
          return -1;
        }
        CopySamplesRaw<int>(right_local,(OPN2_UInt8 *)outputOffset,(int32_t *)out_pos_local,
                            uVar3 >> 1,sampleOffset_00);
      }
      break;
    case OPNMIDI_SampleType_S8:
    case OPNMIDI_SampleType_U8:
      if (OVar1 == OPNMIDI_SampleType_S8) {
        local_98 = opn2_cvtS8;
      }
      else {
        local_98 = opn2_cvtU8;
      }
      if (uVar2 == 1) {
        CopySamplesTransformed<signed_char,int>
                  (right_local,(OPN2_UInt8 *)outputOffset,(int32_t *)out_pos_local,uVar3 >> 1,
                   sampleOffset_00,local_98);
      }
      else if (uVar2 == 2) {
        CopySamplesTransformed<short,int>
                  (right_local,(OPN2_UInt8 *)outputOffset,(int32_t *)out_pos_local,uVar3 >> 1,
                   sampleOffset_00,local_98);
      }
      else {
        if (uVar2 != 4) {
          return -1;
        }
        CopySamplesTransformed<int,int>
                  (right_local,(OPN2_UInt8 *)outputOffset,(int32_t *)out_pos_local,uVar3 >> 1,
                   sampleOffset_00,local_98);
      }
      break;
    case OPNMIDI_SampleType_F32:
      if (uVar2 != 4) {
        return -1;
      }
      CopySamplesTransformed<float,float>
                (right_local,(OPN2_UInt8 *)outputOffset,(int32_t *)out_pos_local,uVar3 >> 1,
                 sampleOffset_00,opn2_cvtReal<float>);
      break;
    case OPNMIDI_SampleType_F64:
      if (uVar2 != 8) {
        return -1;
      }
      CopySamplesTransformed<double,double>
                (right_local,(OPN2_UInt8 *)outputOffset,(int32_t *)out_pos_local,uVar3 >> 1,
                 sampleOffset_00,opn2_cvtReal<double>);
      break;
    case OPNMIDI_SampleType_S24:
    case OPNMIDI_SampleType_U24:
      if (OVar1 == OPNMIDI_SampleType_S24) {
        local_b8 = opn2_cvtS24;
      }
      else {
        local_b8 = opn2_cvtU24;
      }
      if (uVar2 != 4) {
        return -1;
      }
      CopySamplesTransformed<int,int>
                (right_local,(OPN2_UInt8 *)outputOffset,(int32_t *)out_pos_local,uVar3 >> 1,
                 sampleOffset_00,local_b8);
      break;
    case OPNMIDI_SampleType_S32:
    case OPNMIDI_SampleType_U32:
      if (OVar1 == OPNMIDI_SampleType_S32) {
        local_c0 = opn2_cvtS32;
      }
      else {
        local_c0 = opn2_cvtU32;
      }
      if (uVar2 != 4) {
        return -1;
      }
      CopySamplesTransformed<int,int>
                (right_local,(OPN2_UInt8 *)outputOffset,(int32_t *)out_pos_local,uVar3 >> 1,
                 sampleOffset_00,local_c0);
      break;
    default:
      return -1;
    }
  }
  return 0;
}

Assistant:

static int SendStereoAudio(int         samples_requested,
                           ssize_t     in_size,
                           int32_t    *_in,
                           ssize_t     out_pos,
                           OPN2_UInt8 *left,
                           OPN2_UInt8 *right,
                           const OPNMIDI_AudioFormat *format)
{
    if(!in_size)
        return 0;
    size_t outputOffset = static_cast<size_t>(out_pos);
    size_t inSamples    = static_cast<size_t>(in_size * 2);
    size_t maxSamples   = static_cast<size_t>(samples_requested) - outputOffset;
    size_t toCopy       = std::min(maxSamples, inSamples);

    OPNMIDI_SampleType sampleType = format->type;
    const unsigned containerSize = format->containerSize;
    const unsigned sampleOffset = format->sampleOffset;

    left  += (outputOffset / 2) * sampleOffset;
    right += (outputOffset / 2) * sampleOffset;

    typedef int32_t(&pfnConvert)(int32_t);

    switch(sampleType) {
    case OPNMIDI_SampleType_S8:
    case OPNMIDI_SampleType_U8:
    {
        pfnConvert cvt = (sampleType == OPNMIDI_SampleType_S8) ? opn2_cvtS8 : opn2_cvtU8;
        switch(containerSize) {
        case sizeof(int8_t):
            CopySamplesTransformed<int8_t>(left, right, _in, toCopy / 2, sampleOffset, cvt);
            break;
        case sizeof(int16_t):
            CopySamplesTransformed<int16_t>(left, right, _in, toCopy / 2, sampleOffset, cvt);
            break;
        case sizeof(int32_t):
            CopySamplesTransformed<int32_t>(left, right, _in, toCopy / 2, sampleOffset, cvt);
            break;
        default:
            return -1;
        }
        break;
    }
    case OPNMIDI_SampleType_S16:
    case OPNMIDI_SampleType_U16:
    {
        pfnConvert cvt = (sampleType == OPNMIDI_SampleType_S16) ? opn2_cvtS16 : opn2_cvtU16;
        switch(containerSize) {
        case sizeof(int16_t):
            CopySamplesTransformed<int16_t>(left, right, _in, toCopy / 2, sampleOffset, cvt);
            break;
        case sizeof(int32_t):
            CopySamplesRaw<int32_t>(left, right, _in, toCopy / 2, sampleOffset);
            break;
        default:
            return -1;
        }
        break;
    }
    case OPNMIDI_SampleType_S24:
    case OPNMIDI_SampleType_U24:
    {
        pfnConvert cvt = (sampleType == OPNMIDI_SampleType_S24) ? opn2_cvtS24 : opn2_cvtU24;
        switch(containerSize) {
        case sizeof(int32_t):
            CopySamplesTransformed<int32_t>(left, right, _in, toCopy / 2, sampleOffset, cvt);
            break;
        default:
            return -1;
        }
        break;
    }
    case OPNMIDI_SampleType_S32:
    case OPNMIDI_SampleType_U32:
    {
        pfnConvert cvt = (sampleType == OPNMIDI_SampleType_S32) ? opn2_cvtS32 : opn2_cvtU32;
        switch(containerSize) {
        case sizeof(int32_t):
            CopySamplesTransformed<int32_t>(left, right, _in, toCopy / 2, sampleOffset, cvt);
            break;
        default:
            return -1;
        }
        break;
    }
    case OPNMIDI_SampleType_F32:
        if(containerSize != sizeof(float))
            return -1;
        CopySamplesTransformed<float>(left, right, _in, toCopy / 2, sampleOffset, opn2_cvtReal<float>);
        break;
    case OPNMIDI_SampleType_F64:
        if(containerSize != sizeof(double))
            return -1;
        CopySamplesTransformed<double>(left, right, _in, toCopy / 2, sampleOffset, opn2_cvtReal<double>);
        break;
    default:
        return -1;
    }

    return 0;
}